

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

void xmlDumpElementTable(xmlBufferPtr buf,xmlElementTablePtr table)

{
  xmlFreeFunc p_Var1;
  int iVar2;
  xmlSaveCtxtPtr ctxt;
  xmlChar *pxVar3;
  
  if (table != (xmlElementTablePtr)0x0 && buf != (xmlBufferPtr)0x0) {
    ctxt = xmlSaveToBuffer(buf,(char *)0x0,0);
    xmlHashScan(table,xmlDumpElementDeclScan,ctxt);
    iVar2 = xmlSaveFinish(ctxt);
    p_Var1 = xmlFree;
    if (iVar2 != 0) {
      pxVar3 = xmlBufferDetach(buf);
      (*p_Var1)(pxVar3);
      return;
    }
  }
  return;
}

Assistant:

void
xmlDumpElementTable(xmlBufferPtr buf, xmlElementTablePtr table) {
    xmlSaveCtxtPtr save;

    if ((buf == NULL) || (table == NULL))
        return;

    save = xmlSaveToBuffer(buf, NULL, 0);
    xmlHashScan(table, xmlDumpElementDeclScan, save);
    if (xmlSaveFinish(save) != XML_ERR_OK)
        xmlFree(xmlBufferDetach(buf));
}